

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::addUnitFlagStrings(precise_unit *un,string *unitString)

{
  bool bVar1;
  ulong uVar2;
  unit_data local_24;
  unit_data local_20;
  unit_data local_1c;
  string *local_18;
  string *unitString_local;
  precise_unit *un_local;
  
  local_18 = unitString;
  unitString_local = (string *)un;
  local_1c = precise_unit::base_units(un);
  bVar1 = detail::unit_data::has_i_flag(&local_1c);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::append((char *)local_18);
    }
    else {
      std::__cxx11::string::operator=((string *)local_18,"flag");
    }
  }
  local_20 = precise_unit::base_units((precise_unit *)unitString_local);
  bVar1 = detail::unit_data::has_e_flag(&local_20);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::insert((ulong)local_18,(char *)0x0);
    }
    else {
      std::__cxx11::string::operator=((string *)local_18,"eflag");
    }
  }
  local_24 = precise_unit::base_units((precise_unit *)unitString_local);
  bVar1 = detail::unit_data::is_per_unit(&local_24);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::insert((ulong)local_18,(char *)0x0);
    }
    else {
      std::__cxx11::string::operator=((string *)local_18,"pu");
    }
  }
  return;
}

Assistant:

static void addUnitFlagStrings(const precise_unit& un, std::string& unitString)
{
    if (un.base_units().has_i_flag()) {
        if (unitString.empty()) {
            unitString = "flag";
        } else {
            unitString.append("*flag");
        }
    }
    if (un.base_units().has_e_flag()) {
        if (unitString.empty()) {
            unitString = "eflag";
        } else {
            unitString.insert(0, "eflag*");
        }
    }
    if (un.base_units().is_per_unit()) {
        if (unitString.empty()) {
            unitString = "pu";
        } else {
            unitString.insert(0, "pu*");
        }
    }
}